

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateCreateVectorField
          (KotlinGenerator *this,FieldDef *field,CodeWriter *writer,IDLOptions *options)

{
  Type type;
  bool bVar1;
  size_t sVar2;
  BaseType *type_00;
  Type *type_01;
  undefined8 in_stack_fffffffffffffc78;
  anon_class_8_1_72ac95b1 local_2e0;
  function<void_()> local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288 [2];
  string local_248;
  allocator<char> local_221;
  string local_220;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  string local_170;
  allocator<char> local_149;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  string method_name;
  Type vector_type;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  FieldDef *field_local;
  KotlinGenerator *this_local;
  
  Type::VectorType((Type *)((long)&method_name.field_2 + 8),&(field->value).type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"create",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"vector",(allocator<char> *)(params.field_2._M_local_buf + 0xf));
  IdlNamer::Method((string *)local_68,&this->namer_,&local_88,field,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(params.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  GenTypeBasic_abi_cxx11_(&local_128,(KotlinGenerator *)((long)&method_name.field_2 + 8),type_00);
  std::operator+(&local_108,"builder: FlatBufferBuilder, data: ",&local_128);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 &local_108,"Array");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"size",&local_149);
  sVar2 = InlineSize((Type *)((long)&method_name.field_2 + 8));
  NumToString<unsigned_long>(&local_170,sVar2);
  CodeWriter::SetValue(writer,&local_148,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"align",&local_191);
  sVar2 = InlineAlignment((Type *)((long)&method_name.field_2 + 8));
  NumToString<unsigned_long>(&local_1b8,sVar2);
  CodeWriter::SetValue(writer,&local_190,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"root",&local_1d9);
  GenMethod_abi_cxx11_(&local_200,(KotlinGenerator *)((long)&method_name.field_2 + 8),type_01);
  CodeWriter::SetValue(writer,&local_1d8,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"cast",&local_221);
  type.struct_def = vector_type.struct_def;
  type._0_8_ = vector_type._0_8_;
  type.enum_def = vector_type.enum_def;
  type._24_8_ = in_stack_fffffffffffffc78;
  CastToSigned_abi_cxx11_(type);
  CodeWriter::SetValue(writer,&local_220,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  bVar1 = IsUnsigned(method_name.field_2._8_4_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_288,"@kotlin.ExperimentalUnsignedTypes",&local_289);
    CodeWriter::operator+=(writer,local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::allocator<char>::~allocator(&local_289);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Int",&local_2b1);
  local_2e0.writer = writer;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinGenerator::GenerateCreateVectorField(flatbuffers::FieldDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_2d8,&local_2e0);
  GenerateFun(writer,(string *)local_68,(string *)local_e8,&local_2b0,&local_2d8,
              (bool)(options->gen_jvmstatic & 1));
  std::function<void_()>::~function(&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void GenerateCreateVectorField(FieldDef &field, CodeWriter &writer,
                                 const IDLOptions options) const {
    auto vector_type = field.value.type.VectorType();
    auto method_name = namer_.Method("create", field, "vector");
    auto params = "builder: FlatBufferBuilder, data: " +
                  GenTypeBasic(vector_type.base_type) + "Array";
    writer.SetValue("size", NumToString(InlineSize(vector_type)));
    writer.SetValue("align", NumToString(InlineAlignment(vector_type)));
    writer.SetValue("root", GenMethod(vector_type));
    writer.SetValue("cast", CastToSigned(vector_type));

    if (IsUnsigned(vector_type.base_type)) {
      writer += "@kotlin.ExperimentalUnsignedTypes";
    }
    GenerateFun(
        writer, method_name, params, "Int",
        [&]() {
          writer += "builder.startVector({{size}}, data.size, {{align}})";
          writer += "for (i in data.size - 1 downTo 0) {";
          writer.IncrementIdentLevel();
          writer += "builder.add{{root}}(data[i]{{cast}})";
          writer.DecrementIdentLevel();
          writer += "}";
          writer += "return builder.endVector()";
        },
        options.gen_jvmstatic);
  }